

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_bool mz_zip_writer_validate_archive_name(char *pArchive_name)

{
  mz_bool mVar1;
  char cVar2;
  
  cVar2 = *pArchive_name;
  mVar1 = 0;
  if (cVar2 != '/') {
    while (pArchive_name = pArchive_name + 1, cVar2 != '\0') {
      if (cVar2 == ':') {
        return 0;
      }
      if (cVar2 == '\\') {
        return 0;
      }
      cVar2 = *pArchive_name;
    }
    mVar1 = 1;
  }
  return mVar1;
}

Assistant:

static mz_bool mz_zip_writer_validate_archive_name(const char *pArchive_name) {
  // Basic ZIP archive filename validity checks: Valid filenames cannot start
  // with a forward slash, cannot contain a drive letter, and cannot use
  // DOS-style backward slashes.
  if (*pArchive_name == '/')
    return MZ_FALSE;
  while (*pArchive_name) {
    if ((*pArchive_name == '\\') || (*pArchive_name == ':'))
      return MZ_FALSE;
    pArchive_name++;
  }
  return MZ_TRUE;
}